

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O2

void COST_SENSITIVE::parse_label(parser *p,shared_data *sd,void *v,v_array<substring> *words)

{
  substring *psVar1;
  COST_SENSITIVE *this;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  undefined7 extraout_var;
  long lVar6;
  ostream *poVar8;
  vw_exception *pvVar9;
  byte bVar10;
  v_array<substring> *str;
  char *str_00;
  uint uVar11;
  ulong uVar12;
  substring ss;
  substring ss_00;
  substring ss_01;
  substring ss_02;
  float fx;
  uint32_t uStack_214;
  undefined8 uStack_210;
  shared_data *local_200;
  string local_1f8;
  string local_1d8;
  wclass f;
  ostream local_1a8;
  uint64_t uVar7;
  
  str = words;
  local_200 = sd;
  v_array<COST_SENSITIVE::wclass>::clear((v_array<COST_SENSITIVE::wclass> *)v);
  if ((long)words->_end - (long)words->_begin == 0x10) {
    name_value(words->_begin,&p->parse_name,&fx);
    psVar1 = (p->parse_name)._begin;
    this = (COST_SENSITIVE *)psVar1->begin;
    pcVar2 = psVar1->end;
    ss.end = "***shared***";
    ss.begin = pcVar2;
    bVar3 = substring_eq(this,ss,(char *)str);
    ss_00.end = "***label***";
    ss_00.begin = pcVar2;
    bVar4 = substring_eq(this,ss_00,(char *)str);
    str_00 = (char *)(CONCAT71(extraout_var,bVar4) & 0xffffffff);
    if (local_200->ldict == (namedlabels *)0x0) {
      bVar10 = (byte)str_00;
      ss_01.end = "shared";
      ss_01.begin = pcVar2;
      bVar4 = substring_eq(this,ss_01,str_00);
      bVar3 = bVar3 || bVar4;
      ss_02.end = "label";
      ss_02.begin = pcVar2;
      bVar4 = substring_eq(this,ss_02,str_00);
      str_00 = (char *)(ulong)(bVar10 | bVar4);
    }
    if ((byte)((byte)str_00 | bVar3) == 1) {
      if (bVar3 != false) {
        if ((long)(p->parse_name)._end - (long)psVar1 == 0x10) {
          f.x = -3.4028235e+38;
          f.class_index = 0;
          f.partial_prediction = 0.0;
          f.wap_value = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back((v_array<COST_SENSITIVE::wclass> *)v,&f);
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "shared feature vectors should not have costs on: ");
          poVar8 = ::operator<<(poVar8,words->_begin);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
      }
      if ((byte)str_00 == 0) {
        return;
      }
      psVar1 = (p->parse_name)._begin;
      if ((long)(p->parse_name)._end - (long)psVar1 == 0x20) {
        f.x = float_of_substring(psVar1[1]);
        f.class_index = 0;
        f.partial_prediction = 0.0;
        f.wap_value = 0.0;
        v_array<COST_SENSITIVE::wclass>::push_back((v_array<COST_SENSITIVE::wclass> *)v,&f);
        return;
      }
      poVar8 = std::operator<<((ostream *)&std::cerr,
                               "label feature vectors should have exactly one cost on: ");
      poVar8 = ::operator<<(poVar8,words->_begin);
      std::endl<char,std::char_traits<char>>(poVar8);
      return;
    }
  }
  uVar11 = 0;
  while( true ) {
    uVar12 = (ulong)uVar11;
    if ((ulong)((long)words->_end - (long)words->_begin >> 4) <= uVar12) {
      return;
    }
    fx = 0.0;
    uStack_214 = 0;
    uStack_210._0_4_ = 0.0;
    uStack_210._4_4_ = 0.0;
    name_value(words->_begin + uVar12,&p->parse_name,&fx);
    psVar1 = (p->parse_name)._begin;
    lVar6 = (long)(p->parse_name)._end - (long)psVar1 >> 4;
    if (2 < lVar6 - 1U) break;
    if (local_200->ldict == (namedlabels *)0x0) {
      uVar7 = hashstring(*psVar1,0);
      uVar5 = (uint32_t)uVar7;
    }
    else {
      uVar7 = namedlabels::get(local_200->ldict,psVar1);
      uVar5 = (uint32_t)uVar7;
    }
    uStack_214 = uVar5;
    if (((long)(p->parse_name)._end - (long)(p->parse_name)._begin == 0x10) && (0.0 <= fx)) {
      fx = 3.4028235e+38;
    }
    v_array<COST_SENSITIVE::wclass>::push_back((v_array<COST_SENSITIVE::wclass> *)v,(wclass *)&fx);
    uVar11 = uVar11 + 1;
  }
  if (lVar6 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&f);
    poVar8 = std::operator<<(&local_1a8," invalid cost: specification -- no names on: ");
    ::operator<<(poVar8,words->_begin + uVar12);
    pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar9,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cost_sensitive.cc"
               ,0xb4,&local_1d8);
    __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&f);
  poVar8 = std::operator<<(&local_1a8,"malformed cost specification on \'");
  poVar8 = std::operator<<(poVar8,((p->parse_name)._begin)->begin);
  std::operator<<(poVar8,"\'");
  pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar9,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cost_sensitive.cc"
             ,0xbe,&local_1f8);
  __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void parse_label(parser* p, shared_data* sd, void* v, v_array<substring>& words)
{
  label* ld = (label*)v;
  ld->costs.clear();

  // handle shared and label first
  if (words.size() == 1)
  {
    float fx;
    name_value(words[0], p->parse_name, fx);
    bool eq_shared = substring_eq(p->parse_name[0], "***shared***");
    bool eq_label = substring_eq(p->parse_name[0], "***label***");
    if (!sd->ldict)
    {
      eq_shared |= substring_eq(p->parse_name[0], "shared");
      eq_label |= substring_eq(p->parse_name[0], "label");
    }
    if (eq_shared || eq_label)
    {
      if (eq_shared)
      {
        if (p->parse_name.size() != 1)
          cerr << "shared feature vectors should not have costs on: " << words[0] << endl;
        else
        {
          wclass f = {-FLT_MAX, 0, 0., 0.};
          ld->costs.push_back(f);
        }
      }
      if (eq_label)
      {
        if (p->parse_name.size() != 2)
          cerr << "label feature vectors should have exactly one cost on: " << words[0] << endl;
        else
        {
          wclass f = {float_of_substring(p->parse_name[1]), 0, 0., 0.};
          ld->costs.push_back(f);
        }
      }
      return;
    }
  }

  // otherwise this is a "real" example
  for (unsigned int i = 0; i < words.size(); i++)
  {
    wclass f = {0., 0, 0., 0.};
    name_value(words[i], p->parse_name, f.x);

    if (p->parse_name.size() == 0)
      THROW(" invalid cost: specification -- no names on: " << words[i]);

    if (p->parse_name.size() == 1 || p->parse_name.size() == 2 || p->parse_name.size() == 3)
    {
      f.class_index =
          sd->ldict ? (uint32_t)sd->ldict->get(p->parse_name[0]) : (uint32_t)hashstring(p->parse_name[0], 0);
      if (p->parse_name.size() == 1 && f.x >= 0)  // test examples are specified just by un-valued class #s
        f.x = FLT_MAX;
    }
    else
      THROW("malformed cost specification on '" << (p->parse_name[0].begin) << "'");

    ld->costs.push_back(f);
  }
}